

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

int __thiscall
QTextDocumentPrivate::insertBlock
          (QTextDocumentPrivate *this,QChar blockSeparator,int pos,int blockFormat,int charFormat,
          Operation op)

{
  BlockMap *this_00;
  QTextBlockData *pQVar1;
  QTextBlockData *pQVar2;
  quint32 qVar3;
  QTextBlockData *pQVar4;
  Header *pHVar5;
  uint p_1;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  quint32 qVar12;
  quint32 qVar13;
  quint32 qVar14;
  uint p;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  bool bVar18;
  uint local_94;
  QTextUndoCommand local_78;
  QTextFormat local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = this->editBlock;
  this->editBlock = iVar8 + 1;
  if (iVar8 == 0) {
    this->revision = this->revision + 1;
  }
  uVar9 = (uint)(this->text).d.size;
  QString::append((QChar)((short)this + L'\x80'));
  this_00 = &this->blocks;
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  if (uVar6 == 0) {
    bVar18 = true;
    bVar17 = false;
    local_94 = 0;
  }
  else {
    pQVar4 = (this_00->data).field_0.fragments;
    pQVar1 = pQVar4 + uVar6;
    qVar14 = (pQVar1->super_QFragment<3>).parent;
    qVar12 = (pQVar1->super_QFragment<3>).size_left_array[0];
    qVar3 = qVar14;
    uVar15 = uVar6;
    qVar13 = qVar12;
    if (qVar14 == 0) {
      bVar17 = pos - qVar12 == pQVar4[uVar6].super_QFragment<3>.size_array[0] - 1;
    }
    else {
      do {
        uVar16 = qVar3;
        pQVar2 = pQVar4 + uVar16;
        if ((pQVar2->super_QFragment<3>).right == uVar15) {
          qVar13 = qVar13 + (pQVar2->super_QFragment<3>).size_left_array[0] +
                   (pQVar2->super_QFragment<3>).size_array[0];
        }
        qVar3 = (pQVar2->super_QFragment<3>).parent;
        uVar15 = uVar16;
      } while (qVar3 != 0);
      uVar7 = uVar6;
      do {
        pQVar2 = pQVar4 + qVar14;
        if ((pQVar2->super_QFragment<3>).right == uVar7) {
          qVar12 = qVar12 + (pQVar2->super_QFragment<3>).size_left_array[0] +
                   (pQVar2->super_QFragment<3>).size_array[0];
        }
        qVar3 = (pQVar2->super_QFragment<3>).parent;
        uVar7 = qVar14;
        qVar14 = qVar3;
      } while (qVar3 != 0);
      bVar17 = pos - qVar13 == pQVar4[uVar6].super_QFragment<3>.size_array[0] - 1;
    }
    bVar18 = qVar12 == pos;
    local_94 = *(int *)&pQVar1->field_0x44 * 2 >> 1;
    bVar17 = (bool)(bVar17 ^ 1);
  }
  iVar8 = insert_block(this,pos,uVar9,charFormat,blockFormat,op,5);
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  pHVar5 = (this->blocks).data.field_0.head;
  local_78.command = 4;
  local_78._2_1_ = this->editBlock != 0;
  uVar11 = (ulong)uVar6;
  local_78.operation = (quint8)op;
  local_78.field_8._4_4_ = 0xaaaaaaaa;
  local_78.field_8.blockFormat = blockFormat;
  local_78._28_4_ = 0xaaaaaaaa;
  local_78.revision = *(int *)((long)pHVar5 + uVar11 * 0x48 + 0x44) * 2 >> 1;
  local_78.format = charFormat;
  local_78.strPos = uVar9;
  local_78.pos = pos;
  appendUndoItem(this,&local_78);
  uVar15 = local_94;
  if (bVar17) {
    uVar15 = this->revision;
  }
  if (bVar18) {
    uVar15 = this->revision;
  }
  *(uint *)((long)pHVar5 + uVar11 * 0x48 + 0x44) =
       *(uint *)((long)pHVar5 + uVar11 * 0x48 + 0x44) & 0x80000000 | uVar15 & 0x7fffffff;
  uVar9 = QFragmentMapData<QTextBlockData>::next(&this_00->data,uVar6);
  if (uVar9 != 0) {
    pHVar5 = (this->blocks).data.field_0.head;
    if (!bVar18) {
      local_94 = this->revision;
    }
    *(uint *)((long)pHVar5 + (ulong)uVar9 * 0x48 + 0x44) =
         *(uint *)((long)pHVar5 + (ulong)uVar9 * 0x48 + 0x44) & 0x80000000 | local_94 & 0x7fffffff;
  }
  QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)this + 0xe8);
  QTextFormat::toCharFormat(&local_58);
  QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
  iVar10 = QTextFormat::objectIndex(&local_58);
  QTextFormat::~QTextFormat(&local_58);
  if (iVar10 == -1) {
    this->field_0x294 = this->field_0x294 | 1;
  }
  endEditBlock(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int QTextDocumentPrivate::insertBlock(QChar blockSeparator,
                                  int pos, int blockFormat, int charFormat, QTextUndoCommand::Operation op)
{
    Q_ASSERT(formats.format(blockFormat).isBlockFormat());
    Q_ASSERT(formats.format(charFormat).isCharFormat());
    Q_ASSERT(pos >= 0 && (pos < fragments.length() || (pos == 0 && fragments.length() == 0)));
    Q_ASSERT(isValidBlockSeparator(blockSeparator));

    beginEditBlock();

    int strPos = text.size();
    text.append(blockSeparator);

    int ob = blocks.findNode(pos);
    bool atBlockEnd = true;
    bool atBlockStart = true;
    int oldRevision = 0;
    if (ob) {
        atBlockEnd = (pos - blocks.position(ob) == blocks.size(ob)-1);
        atBlockStart = ((int)blocks.position(ob) == pos);
        oldRevision = blocks.fragment(ob)->revision;
    }

    const int fragment = insert_block(pos, strPos, charFormat, blockFormat, op, QTextUndoCommand::BlockRemoved);

    Q_ASSERT(blocks.length() == fragments.length());

    int b = blocks.findNode(pos);
    QTextBlockData *B = blocks.fragment(b);

    QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::BlockInserted, (editBlock != 0),
                            op, charFormat, strPos, pos, blockFormat,
                            B->revision);

    appendUndoItem(c);
    Q_ASSERT(undoState == undoStack.size());

    // update revision numbers of the modified blocks.
    B->revision = (atBlockEnd && !atBlockStart)? oldRevision : revision;
    b = blocks.next(b);
    if (b) {
        B = blocks.fragment(b);
        B->revision = atBlockStart ? oldRevision : revision;
    }

    if (formats.charFormat(charFormat).objectIndex() == -1)
        needsEnsureMaximumBlockCount = true;

    endEditBlock();
    return fragment;
}